

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

void xmlFreeURI(xmlURIPtr uri)

{
  if (uri != (xmlURIPtr)0x0) {
    if (uri->scheme != (char *)0x0) {
      (*xmlFree)(uri->scheme);
    }
    if (uri->server != (char *)0x0) {
      (*xmlFree)(uri->server);
    }
    if (uri->user != (char *)0x0) {
      (*xmlFree)(uri->user);
    }
    if (uri->path != (char *)0x0) {
      (*xmlFree)(uri->path);
    }
    if (uri->fragment != (char *)0x0) {
      (*xmlFree)(uri->fragment);
    }
    if (uri->opaque != (char *)0x0) {
      (*xmlFree)(uri->opaque);
    }
    if (uri->authority != (char *)0x0) {
      (*xmlFree)(uri->authority);
    }
    if (uri->query != (char *)0x0) {
      (*xmlFree)(uri->query);
    }
    if (uri->query_raw != (char *)0x0) {
      (*xmlFree)(uri->query_raw);
    }
    (*xmlFree)(uri);
    return;
  }
  return;
}

Assistant:

void
xmlFreeURI(xmlURIPtr uri) {
    if (uri == NULL) return;

    if (uri->scheme != NULL) xmlFree(uri->scheme);
    if (uri->server != NULL) xmlFree(uri->server);
    if (uri->user != NULL) xmlFree(uri->user);
    if (uri->path != NULL) xmlFree(uri->path);
    if (uri->fragment != NULL) xmlFree(uri->fragment);
    if (uri->opaque != NULL) xmlFree(uri->opaque);
    if (uri->authority != NULL) xmlFree(uri->authority);
    if (uri->query != NULL) xmlFree(uri->query);
    if (uri->query_raw != NULL) xmlFree(uri->query_raw);
    xmlFree(uri);
}